

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

bool __thiscall imrt::Station::canReduceIntensity(Station *this,int beam)

{
  bool bVar1;
  long lVar2;
  
  if (this->max_apertures < 1) {
    return false;
  }
  lVar2 = 0;
  while ((bVar1 = isOpenBeamlet(this,beam,(int)lVar2), !bVar1 ||
         ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2] <= 0.0))) {
    lVar2 = lVar2 + 1;
    if (this->max_apertures <= lVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Station::canReduceIntensity(int beam){
    for (int i =0;i<max_apertures;i++)
      if (isOpenBeamlet(beam,i) && intensity[i]>0) return(true);
    return(false);
  }